

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ScrollController.cpp
# Opt level: O1

void __thiscall Rml::ScrollController::UpdateSmoothscroll(ScrollController *this,float dp_ratio)

{
  Vector2f VVar1;
  double dVar2;
  code *pcVar3;
  Vector2f a;
  Vector2f a_00;
  Vector2f VVar4;
  bool bVar5;
  int i;
  SystemInterface *pSVar6;
  long lVar7;
  float fVar8;
  float fVar9;
  float fVar10;
  float fVar11;
  undefined4 extraout_XMM0_Da;
  undefined4 extraout_XMM0_Db;
  undefined4 extraout_XMM0_Dc;
  undefined4 extraout_XMM0_Dc_00;
  undefined4 extraout_XMM0_Dc_01;
  undefined4 extraout_XMM0_Dd;
  undefined4 extraout_XMM0_Dd_00;
  undefined4 extraout_XMM0_Dd_01;
  float fVar12;
  float fVar13;
  float fVar14;
  float fVar15;
  Vector2f scroll_distance;
  Vector2f target_delta;
  float local_a8;
  float fStack_a4;
  Vector2f local_78;
  undefined1 local_68 [8];
  undefined4 uStack_60;
  undefined4 uStack_5c;
  float local_58;
  float fStack_54;
  float fStack_50;
  float fStack_4c;
  undefined8 local_40;
  undefined1 local_38 [16];
  undefined1 local_28 [16];
  
  if (((this->mode != Smoothscroll) || (this->target == (Element *)0x0)) &&
     (bVar5 = Assert("RMLUI_ASSERT(mode == Mode::Smoothscroll && target)",
                     "/workspace/llm4binary/github/license_c_cmakelists/mikke89[P]RmlUi/Source/Core/ScrollController.cpp"
                     ,0xa0), !bVar5)) {
    pcVar3 = (code *)invalidInstructionException();
    (*pcVar3)();
  }
  VVar1 = this->smoothscroll_scrolled_distance;
  fVar14 = (this->smoothscroll_target_distance).x - VVar1.x;
  fVar12 = (this->smoothscroll_target_distance).y - VVar1.y;
  local_40 = CONCAT44(fVar12,fVar14);
  VVar1 = Math::Absolute(VVar1);
  fStack_54 = VVar1.y;
  local_68._4_4_ = fStack_54;
  local_68._0_4_ = VVar1.x / dp_ratio;
  uStack_60 = extraout_XMM0_Dc;
  uStack_5c = extraout_XMM0_Dd;
  local_58 = fStack_54 / dp_ratio;
  fVar14 = fVar14 / dp_ratio;
  fVar12 = fVar12 / dp_ratio;
  VVar1.y = fVar12;
  VVar1.x = fVar14;
  fStack_50 = fStack_54;
  fStack_4c = fStack_54;
  VVar1 = Math::Absolute(VVar1);
  local_38._8_4_ = extraout_XMM0_Dc_00;
  local_38._0_4_ = VVar1.x;
  local_38._4_4_ = VVar1.y;
  local_38._12_4_ = extraout_XMM0_Dd_00;
  local_28 = ZEXT416(-(uint)(0.0 < fVar12) & 0x3f800000 |
                     ~-(uint)(0.0 < fVar12) & -(uint)(fVar12 < 0.0) & 0xbf800000);
  Tween::Tween((Tween *)&local_78,Exponential,Out);
  VVar4.y = local_58 / 50.0;
  VVar4.x = (float)local_68._0_4_ / 50.0;
  VVar1 = Math::Min<Rml::Vector2<float>>(VVar4,(Vector2f)0x3f8000003f800000);
  local_58 = (float)local_38._4_4_;
  fStack_54 = (float)local_38._4_4_;
  fStack_50 = (float)local_38._4_4_;
  fStack_4c = (float)local_38._4_4_;
  a.y = (float)local_38._4_4_ / 50.0;
  a.x = (float)local_38._0_4_ / 50.0;
  VVar4 = Math::Min<Rml::Vector2<float>>(a,(Vector2f)0x3f8000003f800000);
  uStack_60 = extraout_XMM0_Dc_01;
  local_68._0_4_ = VVar4.x;
  local_68._4_4_ = VVar4.y;
  uStack_5c = extraout_XMM0_Dd_01;
  local_a8 = VVar1.x;
  fVar8 = Tween::operator()((Tween *)&local_78,local_a8);
  fVar9 = Tween::operator()((Tween *)&local_78,(float)local_68._0_4_);
  fStack_a4 = VVar1.y;
  fVar10 = Tween::operator()((Tween *)&local_78,fStack_a4);
  fVar11 = Tween::operator()((Tween *)&local_78,(float)local_68._4_4_);
  fVar13 = (float)local_28._0_4_ * dp_ratio;
  a_00.y = local_58 * 0.05 * local_58 + 800.0;
  a_00.x = (float)local_38._0_4_ * 0.05 * (float)local_38._0_4_ + 800.0;
  VVar1 = Math::Min<Rml::Vector2<float>>(a_00,(Vector2f)0x461c4000461c4000);
  dVar2 = this->previous_update_time;
  pSVar6 = GetSystemInterface();
  (*pSVar6->_vptr_SystemInterface[2])(pSVar6);
  this->previous_update_time = (double)CONCAT44(extraout_XMM0_Db,extraout_XMM0_Da);
  fVar15 = (float)((double)CONCAT44(extraout_XMM0_Db,extraout_XMM0_Da) - dVar2);
  fVar12 = 0.06666667;
  if (fVar15 <= 0.06666667) {
    fVar12 = fVar15;
  }
  fVar15 = (float)(-(uint)(fVar15 < 0.002) & 0x3b03126f | ~-(uint)(fVar15 < 0.002) & (uint)fVar12);
  fVar12 = this->smoothscroll_speed_factor;
  fVar14 = Math::Round((float)(-(uint)(0.0 < fVar14) & 0x3f800000 |
                              ~-(uint)(0.0 < fVar14) & -(uint)(fVar14 < 0.0) & 0xbf800000) *
                       dp_ratio * (fVar9 * fVar8 * 0.8 + 0.2) * VVar1.x * fVar12 * fVar15);
  fVar12 = Math::Round(VVar1.y * (fVar11 * fVar10 * 0.8 + 0.2) * fVar13 * fVar12 * fVar15);
  local_78.y = fVar12;
  local_78.x = fVar14;
  lVar7 = 0;
  do {
    fVar12 = *(float *)(local_38 + lVar7 * 4 + -8);
    if (fVar12 <= 0.0) {
      if (fVar12 < 0.0) {
        fVar14 = (&local_78.x)[lVar7];
        if (-1.0 <= (&local_78.x)[lVar7]) {
          fVar14 = -1.0;
        }
        if (fVar14 <= fVar12) {
          fVar14 = fVar12;
        }
        goto LAB_00264b97;
      }
      (&local_78.x)[lVar7] = 0.0;
    }
    else {
      fVar14 = (&local_78.x)[lVar7];
      if (fVar14 <= 1.0) {
        fVar14 = 1.0;
      }
      if (fVar12 <= fVar14) {
        fVar14 = fVar12;
      }
LAB_00264b97:
      (&local_78.x)[lVar7] = fVar14;
    }
    lVar7 = lVar7 + 1;
    if (lVar7 != 1) {
      (this->smoothscroll_scrolled_distance).x =
           (this->smoothscroll_scrolled_distance).x + local_78.x;
      (this->smoothscroll_scrolled_distance).y =
           local_78.y + (this->smoothscroll_scrolled_distance).y;
      PerformScrollOnTarget(this,local_78);
      fVar12 = (this->smoothscroll_target_distance).x - (this->smoothscroll_scrolled_distance).x;
      fVar14 = (this->smoothscroll_target_distance).y - (this->smoothscroll_scrolled_distance).y;
      if (fVar12 * fVar12 + fVar14 * fVar14 < 0.1) {
        this->mode = None;
        this->target = (Element *)0x0;
        (this->autoscroll_start_position).x = 0;
        (this->autoscroll_start_position).y = 0;
        (this->autoscroll_accumulated_length).x = 0.0;
        (this->autoscroll_accumulated_length).y = 0.0;
        this->autoscroll_moved = false;
        (this->smoothscroll_target_distance).x = 0.0;
        (this->smoothscroll_target_distance).y = 0.0;
        (this->smoothscroll_scrolled_distance).x = 0.0;
        (this->smoothscroll_scrolled_distance).y = 0.0;
      }
      return;
    }
  } while( true );
}

Assistant:

void ScrollController::UpdateSmoothscroll(float dp_ratio)
{
	RMLUI_ASSERT(mode == Mode::Smoothscroll && target);

	const Vector2f target_delta = Vector2f(smoothscroll_target_distance - smoothscroll_scrolled_distance);
	const Vector2f velocity = CalculateSmoothscrollVelocity(target_delta, smoothscroll_scrolled_distance, dp_ratio);

	const float dt = UpdateTime();
	Vector2f scroll_distance = (smoothscroll_speed_factor * velocity * dt).Round();

	for (int i = 0; i < 2; i++)
	{
		// Ensure minimum scroll speed of 1px/frame, and clamp the distance to the target in case of overshooting
		// integration. As opposed to autoscroll, we don't care about fractional speeds here since we want to be fast.
		if (target_delta[i] > 0.f)
			scroll_distance[i] = Math::Min(Math::Max(scroll_distance[i], 1.f), target_delta[i]);
		else if (target_delta[i] < 0.f)
			scroll_distance[i] = Math::Max(Math::Min(scroll_distance[i], -1.f), target_delta[i]);
		else
			scroll_distance[i] = 0.f;
	}

#if 0
	// Useful debugging output for velocity model tuning.
	Log::Message(Log::LT_INFO, "Scroll  y0 %8.2f   y1 %8.2f   v %8.2f   d %8.2f", smoothscroll_scrolled_distance.y, target_delta.y, velocity.y,
		scroll_distance.y);
#endif

	smoothscroll_scrolled_distance += scroll_distance;
	PerformScrollOnTarget(scroll_distance);

	if (HasSmoothscrollReachedTarget())
		Reset();
}